

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void rhash_sha3_permutation(uint64_t *state)

{
  int local_14;
  int round;
  uint64_t *state_local;
  
  for (local_14 = 0; local_14 < 0x18; local_14 = local_14 + 1) {
    keccak_theta(state);
    state[1] = state[1] << 1 ^ state[1] >> 0x3f;
    state[2] = state[2] << 0x3e ^ state[2] >> 2;
    state[3] = state[3] << 0x1c ^ state[3] >> 0x24;
    state[4] = state[4] << 0x1b ^ state[4] >> 0x25;
    state[5] = state[5] << 0x24 ^ state[5] >> 0x1c;
    state[6] = state[6] << 0x2c ^ state[6] >> 0x14;
    state[7] = state[7] << 6 ^ state[7] >> 0x3a;
    state[8] = state[8] << 0x37 ^ state[8] >> 9;
    state[9] = state[9] << 0x14 ^ state[9] >> 0x2c;
    state[10] = state[10] << 3 ^ state[10] >> 0x3d;
    state[0xb] = state[0xb] << 10 ^ state[0xb] >> 0x36;
    state[0xc] = state[0xc] << 0x2b ^ state[0xc] >> 0x15;
    state[0xd] = state[0xd] << 0x19 ^ state[0xd] >> 0x27;
    state[0xe] = state[0xe] << 0x27 ^ state[0xe] >> 0x19;
    state[0xf] = state[0xf] << 0x29 ^ state[0xf] >> 0x17;
    state[0x10] = state[0x10] << 0x2d ^ state[0x10] >> 0x13;
    state[0x11] = state[0x11] << 0xf ^ state[0x11] >> 0x31;
    state[0x12] = state[0x12] << 0x15 ^ state[0x12] >> 0x2b;
    state[0x13] = state[0x13] << 8 ^ state[0x13] >> 0x38;
    state[0x14] = state[0x14] << 0x12 ^ state[0x14] >> 0x2e;
    state[0x15] = state[0x15] << 2 ^ state[0x15] >> 0x3e;
    state[0x16] = state[0x16] << 0x3d ^ state[0x16] >> 3;
    state[0x17] = state[0x17] << 0x38 ^ state[0x17] >> 8;
    state[0x18] = state[0x18] << 0xe ^ state[0x18] >> 0x32;
    keccak_pi(state);
    keccak_chi(state);
    *state = keccak_round_constants[local_14] ^ *state;
  }
  return;
}

Assistant:

static void rhash_sha3_permutation(uint64_t* state)
{
	int round;
	for (round = 0; round < NumberOfRounds; round++)
	{
		keccak_theta(state);

		/* apply Keccak rho() transformation */
		state[ 1] = ROTL64(state[ 1],  1);
		state[ 2] = ROTL64(state[ 2], 62);
		state[ 3] = ROTL64(state[ 3], 28);
		state[ 4] = ROTL64(state[ 4], 27);
		state[ 5] = ROTL64(state[ 5], 36);
		state[ 6] = ROTL64(state[ 6], 44);
		state[ 7] = ROTL64(state[ 7],  6);
		state[ 8] = ROTL64(state[ 8], 55);
		state[ 9] = ROTL64(state[ 9], 20);
		state[10] = ROTL64(state[10],  3);
		state[11] = ROTL64(state[11], 10);
		state[12] = ROTL64(state[12], 43);
		state[13] = ROTL64(state[13], 25);
		state[14] = ROTL64(state[14], 39);
		state[15] = ROTL64(state[15], 41);
		state[16] = ROTL64(state[16], 45);
		state[17] = ROTL64(state[17], 15);
		state[18] = ROTL64(state[18], 21);
		state[19] = ROTL64(state[19],  8);
		state[20] = ROTL64(state[20], 18);
		state[21] = ROTL64(state[21],  2);
		state[22] = ROTL64(state[22], 61);
		state[23] = ROTL64(state[23], 56);
		state[24] = ROTL64(state[24], 14);

		keccak_pi(state);
		keccak_chi(state);

		/* apply iota(state, round) */
		*state ^= keccak_round_constants[round];
	}
}